

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::PathTypeHandlerBase::SetAllPropertiesToUndefined
          (PathTypeHandlerBase *this,DynamicObject *instance,bool invalidateFixedFields)

{
  ushort uVar1;
  ScriptContext *scriptContext;
  RecyclableObject *value;
  PropertyRecord *pPVar2;
  undefined7 in_register_00000011;
  uint uVar3;
  
  uVar1 = (this->super_DynamicTypeHandler).unusedBytes;
  if (((int)CONCAT71(in_register_00000011,invalidateFixedFields) != 0) && (1 < uVar1)) {
    scriptContext =
         (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
    uVar3 = 0;
    do {
      pPVar2 = TypePath::GetPropertyIdUnchecked((this->typePath).ptr,uVar3);
      InvalidateFixedFieldAt(this,pPVar2->pid,(PropertyIndex)uVar3,scriptContext);
      uVar3 = uVar3 + 1;
    } while (uVar1 >> 1 != uVar3);
  }
  if (1 < uVar1) {
    value = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).undefinedValue.ptr;
    uVar3 = 0;
    do {
      DynamicTypeHandler::SetSlotUnchecked(instance,uVar3,value);
      uVar3 = uVar3 + 1;
    } while (uVar1 >> 1 != uVar3);
  }
  return;
}

Assistant:

void PathTypeHandlerBase::SetAllPropertiesToUndefined(DynamicObject* instance, bool invalidateFixedFields)
    {
        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.
        int propertyCount = GetPathLength();

#if ENABLE_FIXED_FIELDS
        if (invalidateFixedFields)
        {
            Js::ScriptContext* scriptContext = instance->GetScriptContext();
            for (PropertyIndex propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
            {
                PropertyId propertyId = this->GetTypePath()->GetPropertyIdUnchecked(propertyIndex)->GetPropertyId();
                InvalidateFixedFieldAt(propertyId, propertyIndex, scriptContext);
            }
        }
#endif

        Js::RecyclableObject* undefined = instance->GetLibrary()->GetUndefined();
        for (PropertyIndex propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
        {
            SetSlotUnchecked(instance, propertyIndex, undefined);
        }

    }